

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall Clasp::ClaspFacade::updateStats(ClaspFacade *this)

{
  uint32 uVar1;
  double dVar2;
  uint64 uVar3;
  ulong uVar4;
  Statistics *this_00;
  
  this_00 = (Statistics *)((this->stats_).ptr_ & 0xfffffffffffffffe);
  if (this_00 != (Statistics *)0x0) {
    Statistics::end(this_00);
  }
  uVar4 = (this->accu_).ptr_ & 0xfffffffffffffffe;
  if ((uVar4 != 0) && (uVar1 = (this->step_).step, *(uint32 *)(uVar4 + 0x40) != uVar1)) {
    dVar2 = (this->step_).cpuTime;
    *(double *)(uVar4 + 8) = *(double *)(uVar4 + 8) + (this->step_).totalTime;
    *(double *)(uVar4 + 0x10) = *(double *)(uVar4 + 0x10) + dVar2;
    dVar2 = (this->step_).unsatTime;
    *(double *)(uVar4 + 0x18) = (this->step_).solveTime + *(double *)(uVar4 + 0x18);
    *(double *)(uVar4 + 0x20) = dVar2 + *(double *)(uVar4 + 0x20);
    *(double *)(uVar4 + 0x28) = (this->step_).satTime + *(double *)(uVar4 + 0x28);
    uVar3 = (this->step_).numOptimal;
    *(uint64 *)(uVar4 + 0x30) = *(long *)(uVar4 + 0x30) + (this->step_).numEnum;
    *(uint64 *)(uVar4 + 0x38) = *(long *)(uVar4 + 0x38) + uVar3;
    *(uint32 *)(uVar4 + 0x40) = uVar1;
    *(Result *)(uVar4 + 0x44) = (this->step_).result;
  }
  return;
}

Assistant:

void ClaspFacade::updateStats() {
	if (stats_.get()) {
		stats_->end();
	}
	if (accu_.get() && accu_->step != step_.step) {
		accu_->totalTime  += step_.totalTime;
		accu_->cpuTime    += step_.cpuTime;
		accu_->solveTime  += step_.solveTime;
		accu_->unsatTime  += step_.unsatTime;
		accu_->satTime    += step_.satTime;
		accu_->numEnum    += step_.numEnum;
		accu_->numOptimal += step_.numOptimal;
		// no aggregation
		accu_->step   = step_.step;
		accu_->result = step_.result;
	}
}